

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>::Data
          (Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *this,
          Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *other,
          size_t reserved)

{
  ulong uVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  ulong uVar5;
  Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *pNVar6;
  long lVar7;
  ulong uVar8;
  size_t numBuckets;
  long lVar9;
  long in_FS_OFFSET;
  R RVar10;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  numBuckets = 0x80;
  if (0x40 < reserved) {
    if (reserved >> 0x3e == 0) {
      lVar7 = 0x3f;
      if (reserved != 0) {
        for (; reserved >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar7 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  this->numBuckets = numBuckets;
  RVar10 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar10.spans;
  uVar1 = other->numBuckets;
  lVar7 = 0;
  for (uVar8 = 0; uVar8 != uVar1 >> 7; uVar8 = uVar8 + 1) {
    pSVar2 = other->spans;
    for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 1) {
      uVar5 = (ulong)pSVar2->offsets[lVar9 + lVar7];
      if (uVar5 != 0xff) {
        pEVar3 = pSVar2[uVar8].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = Data<QHashPrivate::Node<unsigned_char*,QFSFileEnginePrivate::StartAndLength>>::
                   findBucket<unsigned_char*>
                             ((Data<QHashPrivate::Node<unsigned_char*,QFSFileEnginePrivate::StartAndLength>>
                               *)this,(uchar **)(pEVar3 + uVar5));
        pNVar6 = Bucket::insert(&local_48);
        uVar4 = *(undefined8 *)(pEVar3[uVar5].storage.data + 8);
        pNVar6->key = *(uchar **)pEVar3[uVar5].storage.data;
        *(undefined8 *)&pNVar6->value = uVar4;
        (pNVar6->value).length = *(size_t *)(pEVar3[uVar5].storage.data + 0x10);
      }
    }
    lVar7 = lVar7 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }